

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

VkResult Fossilize::CreateShaderModule
                   (VkDevice device,VkShaderModuleCreateInfo *pCreateInfo,
                   VkAllocationCallbacks *pCallbacks,VkShaderModule *pShaderModule)

{
  bool bVar1;
  VkResult VVar2;
  LogLevel LVar3;
  Device *pDVar4;
  VkShaderModuleCreateInfo *create_info;
  VkShaderModuleIdentifierEXT identifier;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT identifierCreateInfo;
  VkShaderModuleCreateInfo tmpCreateInfo;
  
  pDVar4 = get_device_layer((Fossilize *)device,(VkDevice)pCreateInfo);
  *pShaderModule = (VkShaderModule)0x0;
  VVar2 = (*pDVar4->pTable->CreateShaderModule)(device,pCreateInfo,pCallbacks,pShaderModule);
  if (VVar2 == VK_SUCCESS) {
    identifierCreateInfo.identifierSize = 0;
    identifierCreateInfo._20_4_ = 0;
    identifierCreateInfo.pIdentifier = (uint8_t *)0x0;
    identifierCreateInfo.sType =
         VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT;
    identifierCreateInfo._4_4_ = 0;
    identifierCreateInfo.pNext = (void *)0x0;
    identifier.pNext = (void *)0x0;
    identifier.identifier[0xc] = '\0';
    identifier.identifier[0xd] = '\0';
    identifier.identifier[0xe] = '\0';
    identifier.identifier[0xf] = '\0';
    identifier.identifier[0x10] = '\0';
    identifier.identifier[0x11] = '\0';
    identifier.identifier[0x12] = '\0';
    identifier.identifier[0x13] = '\0';
    identifier.identifier[0x14] = '\0';
    identifier.identifier[0x15] = '\0';
    identifier.identifier[0x16] = '\0';
    identifier.identifier[0x17] = '\0';
    identifier.identifier[0x18] = '\0';
    identifier.identifier[0x19] = '\0';
    identifier.identifier[0x1a] = '\0';
    identifier.identifier[0x1b] = '\0';
    identifier.identifier[0x1c] = '\0';
    identifier.identifier[0x1d] = '\0';
    identifier.identifier[0x1e] = '\0';
    identifier.identifier[0x1f] = '\0';
    identifier._52_4_ = 0;
    identifier.identifierSize = 0;
    identifier.identifier[0] = '\0';
    identifier.identifier[1] = '\0';
    identifier.identifier[2] = '\0';
    identifier.identifier[3] = '\0';
    identifier.identifier[4] = '\0';
    identifier.identifier[5] = '\0';
    identifier.identifier[6] = '\0';
    identifier.identifier[7] = '\0';
    identifier.identifier[8] = '\0';
    identifier.identifier[9] = '\0';
    identifier.identifier[10] = '\0';
    identifier.identifier[0xb] = '\0';
    identifier.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT;
    identifier._4_4_ = 0;
    create_info = pCreateInfo;
    if (pDVar4->usesModuleIdentifiers == true) {
      (*pDVar4->pTable->GetShaderModuleIdentifierEXT)(device,*pShaderModule,&identifier);
      identifierCreateInfo.pIdentifier = identifier.identifier;
      tmpCreateInfo.pNext = &identifierCreateInfo;
      identifierCreateInfo.identifierSize = identifier.identifierSize;
      tmpCreateInfo.sType = pCreateInfo->sType;
      tmpCreateInfo._4_4_ = *(undefined4 *)&pCreateInfo->field_0x4;
      identifierCreateInfo.pNext = pCreateInfo->pNext;
      tmpCreateInfo.flags = pCreateInfo->flags;
      tmpCreateInfo._20_4_ = *(undefined4 *)&pCreateInfo->field_0x14;
      tmpCreateInfo.codeSize = pCreateInfo->codeSize;
      create_info = &tmpCreateInfo;
      tmpCreateInfo.pCode = pCreateInfo->pCode;
    }
    bVar1 = StateRecorder::record_shader_module(pDVar4->recorder,*pShaderModule,create_info,0);
    if (!bVar1) {
      LVar3 = get_thread_log_level();
      if ((int)LVar3 < 2) {
        bVar1 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Failed to record shader module, usually caused by unsupported pNext.\n")
        ;
        if (!bVar1) {
          fwrite("Fossilize WARN: Failed to record shader module, usually caused by unsupported pNext.\n"
                 ,0x55,1,_stderr);
        }
      }
    }
  }
  return VVar2;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateShaderModule(VkDevice device, const VkShaderModuleCreateInfo *pCreateInfo,
                                                         const VkAllocationCallbacks *pCallbacks,
                                                         VkShaderModule *pShaderModule)
{
	auto *layer = get_device_layer(device);

	*pShaderModule = VK_NULL_HANDLE;

	auto res = layer->getTable()->CreateShaderModule(device, pCreateInfo, pCallbacks, pShaderModule);

	if (res == VK_SUCCESS)
	{
		// Pass along the module identifier for later reference.
		VkPipelineShaderStageModuleIdentifierCreateInfoEXT identifierCreateInfo =
				{ VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT };
		VkShaderModuleIdentifierEXT identifier =
				{ VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT };
		VkShaderModuleCreateInfo tmpCreateInfo;

		if (layer->requiresModuleIdentifiers())
		{
			layer->getTable()->GetShaderModuleIdentifierEXT(device, *pShaderModule, &identifier);
			identifierCreateInfo.pIdentifier = identifier.identifier;
			identifierCreateInfo.identifierSize = identifier.identifierSize;
			tmpCreateInfo = *pCreateInfo;
			identifierCreateInfo.pNext = tmpCreateInfo.pNext;
			tmpCreateInfo.pNext = &identifierCreateInfo;
			pCreateInfo = &tmpCreateInfo;
		}

		if (!layer->getRecorder().record_shader_module(*pShaderModule, *pCreateInfo))
			LOGW_LEVEL("Failed to record shader module, usually caused by unsupported pNext.\n");
	}

	return res;
}